

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  GLenum GVar2;
  deUint32 dVar3;
  char *__rhs;
  Context *context;
  uint uVar4;
  int iVar5;
  TestCase *this_00;
  undefined4 extraout_var;
  allocator<char> local_141;
  TestNode *local_140;
  StateBoolean *local_138;
  long local_130;
  long local_128;
  long local_120;
  StateBoolean isEnableds [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140 = (TestNode *)this;
  uVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  isEnableds[2].value = (bool)((byte)(uVar4 >> 0xb) & 1);
  isEnableds[0].name = "sample_mask";
  isEnableds[0].description = "SAMPLE_MASK";
  isEnableds[0].targetName = 0x8e51;
  isEnableds[0].value = false;
  isEnableds[0].minimumContext.m_bits = 0x13;
  isEnableds[1].name = "sample_shading";
  isEnableds[1].description = "SAMPLE_SHADING";
  isEnableds[1].targetName = 0x8c36;
  isEnableds[1].value = false;
  isEnableds[1].minimumContext.m_bits = 0x23;
  isEnableds[2].name = "debug_output";
  isEnableds[2].description = "DEBUG_OUTPUT";
  isEnableds[2].targetName = 0x92e0;
  isEnableds[3].name = "debug_output_synchronous";
  isEnableds[3].description = "DEBUG_OUTPUT_SYNCHRONOUS";
  isEnableds[3].targetName = 0x8242;
  isEnableds[3].value = false;
  isEnableds[2].minimumContext.m_bits = isEnableds[1].minimumContext.m_bits;
  isEnableds[3].minimumContext.m_bits = isEnableds[1].minimumContext.m_bits;
  for (local_130 = 0; local_130 != 4; local_130 = local_130 + 1) {
    local_138 = isEnableds + local_130;
    local_128 = 0;
    while( true ) {
      if (local_128 == 0x14) break;
      local_120 = (long)*(int *)((long)init::isEnabledVerifiers + local_128);
      __rhs = *(char **)(&DAT_01e58b88 + local_120 * 8);
      this_00 = (TestCase *)operator_new(0xa0);
      context = (Context *)local_140[1]._vptr_TestNode;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,local_138->name,&local_141);
      std::operator+(&local_50,&local_70,"_");
      std::operator+(&local_90,&local_50,__rhs);
      GVar2 = local_138->targetName;
      bVar1 = local_138->value;
      dVar3 = (local_138->minimumContext).m_bits;
      gles31::TestCase::TestCase(this_00,context,local_90._M_dataplus._M_p,local_138->description);
      iVar5 = (*context->m_renderCtx->_vptr_RenderContext[3])();
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)(this_00 + 1),(Functions *)CONCAT44(extraout_var,iVar5),
                 context->m_testCtx->m_log);
      (this_00->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__IsEnabledStateTestCase_01e58b28;
      *(GLenum *)((long)&this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           GVar2;
      *(bool *)&this_00[1].super_TestCase.super_TestNode.m_name._M_string_length = bVar1;
      *(int *)((long)&this_00[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
           (int)local_120;
      *(deUint32 *)&this_00[1].super_TestCase.super_TestNode.m_name.field_2 = dVar3;
      tcu::TestNode::addChild(local_140,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      local_128 = local_128 + 4;
    }
  }
  return 4;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	const bool isDebugContext = (m_context.getRenderContext().getType().getFlags() & glu::CONTEXT_DEBUG) != 0;

	static const QueryType isEnabledVerifiers[] =
	{
		QUERY_ISENABLED,
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		this->addChild(X);																	\
	}

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		glw::GLenum		targetName;
		bool			value;
		glu::ApiType	minimumContext;
	};

	{
		const StateBoolean isEnableds[] =
		{
			{ "sample_mask",				"SAMPLE_MASK",				GL_SAMPLE_MASK,					false,			glu::ApiType::es(3, 1)},
			{ "sample_shading",				"SAMPLE_SHADING",			GL_SAMPLE_SHADING,				false,			glu::ApiType::es(3, 2)},
			{ "debug_output",				"DEBUG_OUTPUT",				GL_DEBUG_OUTPUT,				isDebugContext,	glu::ApiType::es(3, 2)},
			{ "debug_output_synchronous",	"DEBUG_OUTPUT_SYNCHRONOUS",	GL_DEBUG_OUTPUT_SYNCHRONOUS,	false,			glu::ApiType::es(3, 2)},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		{
			FOR_EACH_VERIFIER(isEnabledVerifiers, new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + "_" + verifierSuffix).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value, isEnableds[testNdx].minimumContext));
		}
	}

#undef FOR_EACH_VERIFIER
}